

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Shutdown(ImGuiContext *context)

{
  ImFontAtlas *this;
  ImGuiWindow **ppIVar1;
  Pair *pPVar2;
  ImGuiColMod *pIVar3;
  ImGuiStyleMod *pIVar4;
  ImFont **ppIVar5;
  ImGuiPopupRef *pIVar6;
  char *pcVar7;
  unsigned_short *puVar8;
  void *pvVar9;
  ImGuiWindowSettings *pIVar10;
  ImGuiSettingsHandler *pIVar11;
  FILE *__stream;
  long lVar12;
  long lVar13;
  
  this = (context->IO).Fonts;
  if ((this != (ImFontAtlas *)0x0) && (context->FontAtlasOwnedByContext == true)) {
    ImFontAtlas::~ImFontAtlas(this);
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(this,GImAllocatorUserData);
  }
  (context->IO).Fonts = (ImFontAtlas *)0x0;
  if (context->Initialized == true) {
    if (context->SettingsLoaded == true) {
      SaveIniSettingsToDisk((context->IO).IniFilename);
    }
    if (0 < (context->Windows).Size) {
      lVar12 = 0;
      do {
        IM_DELETE<ImGuiWindow>((context->Windows).Data[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < (context->Windows).Size);
    }
    ppIVar1 = (context->Windows).Data;
    if (ppIVar1 != (ImGuiWindow **)0x0) {
      (context->Windows).Size = 0;
      (context->Windows).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(ppIVar1,GImAllocatorUserData);
      (context->Windows).Data = (ImGuiWindow **)0x0;
    }
    ppIVar1 = (context->WindowsSortBuffer).Data;
    if (ppIVar1 != (ImGuiWindow **)0x0) {
      (context->WindowsSortBuffer).Size = 0;
      (context->WindowsSortBuffer).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(ppIVar1,GImAllocatorUserData);
      (context->WindowsSortBuffer).Data = (ImGuiWindow **)0x0;
    }
    context->CurrentWindow = (ImGuiWindow *)0x0;
    ppIVar1 = (context->CurrentWindowStack).Data;
    if (ppIVar1 != (ImGuiWindow **)0x0) {
      (context->CurrentWindowStack).Size = 0;
      (context->CurrentWindowStack).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(ppIVar1,GImAllocatorUserData);
      (context->CurrentWindowStack).Data = (ImGuiWindow **)0x0;
    }
    pPVar2 = (context->WindowsById).Data.Data;
    if (pPVar2 != (Pair *)0x0) {
      (context->WindowsById).Data.Size = 0;
      (context->WindowsById).Data.Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pPVar2,GImAllocatorUserData);
      (context->WindowsById).Data.Data = (Pair *)0x0;
    }
    context->NavWindow = (ImGuiWindow *)0x0;
    context->ActiveIdWindow = (ImGuiWindow *)0x0;
    context->MovingWindow = (ImGuiWindow *)0x0;
    context->HoveredWindow = (ImGuiWindow *)0x0;
    context->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar3 = (context->ColorModifiers).Data;
    if (pIVar3 != (ImGuiColMod *)0x0) {
      (context->ColorModifiers).Size = 0;
      (context->ColorModifiers).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      (context->ColorModifiers).Data = (ImGuiColMod *)0x0;
    }
    pIVar4 = (context->StyleModifiers).Data;
    if (pIVar4 != (ImGuiStyleMod *)0x0) {
      (context->StyleModifiers).Size = 0;
      (context->StyleModifiers).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      (context->StyleModifiers).Data = (ImGuiStyleMod *)0x0;
    }
    ppIVar5 = (context->FontStack).Data;
    if (ppIVar5 != (ImFont **)0x0) {
      (context->FontStack).Size = 0;
      (context->FontStack).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
      (context->FontStack).Data = (ImFont **)0x0;
    }
    pIVar6 = (context->OpenPopupStack).Data;
    if (pIVar6 != (ImGuiPopupRef *)0x0) {
      (context->OpenPopupStack).Size = 0;
      (context->OpenPopupStack).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      (context->OpenPopupStack).Data = (ImGuiPopupRef *)0x0;
    }
    pIVar6 = (context->CurrentPopupStack).Data;
    if (pIVar6 != (ImGuiPopupRef *)0x0) {
      (context->CurrentPopupStack).Size = 0;
      (context->CurrentPopupStack).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      (context->CurrentPopupStack).Data = (ImGuiPopupRef *)0x0;
    }
    ImDrawDataBuilder::ClearFreeMemory(&context->DrawDataBuilder);
    ImDrawList::ClearFreeMemory(&context->OverlayDrawList);
    pcVar7 = (context->PrivateClipboard).Data;
    if (pcVar7 != (char *)0x0) {
      (context->PrivateClipboard).Size = 0;
      (context->PrivateClipboard).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pcVar7,GImAllocatorUserData);
      (context->PrivateClipboard).Data = (char *)0x0;
    }
    puVar8 = (context->InputTextState).Text.Data;
    if (puVar8 != (unsigned_short *)0x0) {
      (context->InputTextState).Text.Size = 0;
      (context->InputTextState).Text.Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(puVar8,GImAllocatorUserData);
      (context->InputTextState).Text.Data = (unsigned_short *)0x0;
    }
    pcVar7 = (context->InputTextState).InitialText.Data;
    if (pcVar7 != (char *)0x0) {
      (context->InputTextState).InitialText.Size = 0;
      (context->InputTextState).InitialText.Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pcVar7,GImAllocatorUserData);
      (context->InputTextState).InitialText.Data = (char *)0x0;
    }
    pcVar7 = (context->InputTextState).TempTextBuffer.Data;
    if (pcVar7 != (char *)0x0) {
      (context->InputTextState).TempTextBuffer.Size = 0;
      (context->InputTextState).TempTextBuffer.Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pcVar7,GImAllocatorUserData);
      (context->InputTextState).TempTextBuffer.Data = (char *)0x0;
    }
    if (0 < (context->SettingsWindows).Size) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        pvVar9 = *(void **)((long)&((context->SettingsWindows).Data)->Name + lVar12);
        if (pvVar9 != (void *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          (*GImAllocatorFreeFunc)(pvVar9,GImAllocatorUserData);
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0x20;
      } while (lVar13 < (context->SettingsWindows).Size);
    }
    pIVar10 = (context->SettingsWindows).Data;
    if (pIVar10 != (ImGuiWindowSettings *)0x0) {
      (context->SettingsWindows).Size = 0;
      (context->SettingsWindows).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
      (context->SettingsWindows).Data = (ImGuiWindowSettings *)0x0;
    }
    pIVar11 = (context->SettingsHandlers).Data;
    if (pIVar11 != (ImGuiSettingsHandler *)0x0) {
      (context->SettingsHandlers).Size = 0;
      (context->SettingsHandlers).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
      (context->SettingsHandlers).Data = (ImGuiSettingsHandler *)0x0;
    }
    __stream = (FILE *)context->LogFile;
    if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
      fclose(__stream);
      context->LogFile = (FILE *)0x0;
    }
    if (context->LogClipboard != (ImGuiTextBuffer *)0x0) {
      IM_DELETE<ImGuiTextBuffer>(context->LogClipboard);
    }
    context->LogClipboard = (ImGuiTextBuffer *)0x0;
    context->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    ImGuiContext& g = *context;

    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
        IM_DELETE(g.IO.Fonts);
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialize ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded)
        SaveIniSettingsToDisk(g.IO.IniFilename);

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = NULL;
    g.HoveredRootWindow = NULL;
    g.ActiveIdWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorModifiers.clear();
    g.StyleModifiers.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.CurrentPopupStack.clear();
    g.DrawDataBuilder.ClearFreeMemory();
    g.OverlayDrawList.ClearFreeMemory();
    g.PrivateClipboard.clear();
    g.InputTextState.Text.clear();
    g.InputTextState.InitialText.clear();
    g.InputTextState.TempTextBuffer.clear();

    for (int i = 0; i < g.SettingsWindows.Size; i++)
        IM_DELETE(g.SettingsWindows[i].Name);
    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile && g.LogFile != stdout)
    {
        fclose(g.LogFile);
        g.LogFile = NULL;
    }
    if (g.LogClipboard)
        IM_DELETE(g.LogClipboard);
    g.LogClipboard = NULL;

    g.Initialized = false;
}